

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  void *pvVar5;
  uint8 *puVar6;
  uint uVar7;
  bool bVar8;
  uint32 uVar9;
  Type *this_01;
  pair<int,_int> pVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  UnknownFieldSet *pUVar15;
  pair<unsigned_long,_bool> pVar16;
  pair<unsigned_long,_bool> pVar17;
  pair<unsigned_long,_bool> pVar18;
  pair<unsigned_long,_bool> pVar19;
  
  this_00 = &this->_internal_metadata_;
  do {
    pbVar4 = input->buffer_;
    uVar9 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar9 = (uint32)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar12 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar12) < 0x80)) goto LAB_003d0e53;
        uVar12 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = (ulong)uVar12 | 0x100000000;
    }
    else {
LAB_003d0e53:
      uVar9 = io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar13 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar9 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_003d0bb7_caseD_4;
    uVar7 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar13;
    switch(uVar7) {
    case 1:
      if (cVar11 != '\b') break;
      pbVar4 = input->buffer_;
      if (pbVar4 < input->buffer_end_) {
        bVar2 = *pbVar4;
        uVar13 = (ulong)bVar2;
        uVar9 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_003d0ecb;
        input->buffer_ = pbVar4 + 1;
        bVar8 = true;
      }
      else {
        uVar9 = 0;
LAB_003d0ecb:
        uVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
        bVar8 = -1 < (long)uVar13;
      }
      cVar11 = '\x06';
      if (bVar8) {
        uVar12 = (uint)uVar13;
        if (uVar12 < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          this->ctype_ = uVar12;
        }
        else {
          pvVar5 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar5 & 1) == 0) {
            pUVar15 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar15 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          iVar14 = 1;
LAB_003d0f61:
          UnknownFieldSet::AddVarint(pUVar15,iVar14,(long)(int)uVar12);
        }
LAB_003d0f67:
        cVar11 = '\0';
      }
LAB_003d0f69:
      if (bVar8) goto LAB_003d0c44;
      goto LAB_003d0c46;
    case 2:
      if (cVar11 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar19._8_8_ = 1;
          pVar19.first = (long)(char)uVar3;
        }
        else {
          pVar19 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->packed_ = pVar19.first != 0;
          goto LAB_003d0c44;
        }
LAB_003d0e4c:
        cVar11 = '\x06';
        goto LAB_003d0c46;
      }
      break;
    case 3:
      if (cVar11 != '\x18') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
        input->buffer_ = puVar6 + 1;
        pVar16._8_8_ = 1;
        pVar16.first = (long)(char)uVar3;
      }
      else {
        pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_003d0e4c;
      this->deprecated_ = pVar16.first != 0;
      goto LAB_003d0c44;
    case 4:
    case 7:
    case 8:
    case 9:
      break;
    case 5:
      if (cVar11 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar18._8_8_ = 1;
          pVar18.first = (long)(char)uVar3;
        }
        else {
          pVar18 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_003d0e4c;
        this->lazy_ = pVar18.first != 0;
        goto LAB_003d0c44;
      }
      break;
    case 6:
      if (cVar11 == '0') {
        pbVar4 = input->buffer_;
        if (pbVar4 < input->buffer_end_) {
          bVar2 = *pbVar4;
          uVar13 = (ulong)bVar2;
          uVar9 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_003d0f18;
          input->buffer_ = pbVar4 + 1;
          bVar8 = true;
        }
        else {
          uVar9 = 0;
LAB_003d0f18:
          uVar13 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar8 = -1 < (long)uVar13;
        }
        cVar11 = '\x06';
        if (bVar8) {
          uVar12 = (uint)uVar13;
          if (2 < uVar12) {
            pvVar5 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar5 & 1) == 0) {
              pUVar15 = internal::
                        InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow
                                  (&this_00->
                                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                  );
            }
            else {
              pUVar15 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
            }
            iVar14 = 6;
            goto LAB_003d0f61;
          }
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
          this->jstype_ = uVar12;
          goto LAB_003d0f67;
        }
        goto LAB_003d0f69;
      }
      break;
    case 10:
      if (cVar11 == 'P') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar6 + 1;
          pVar17._8_8_ = 1;
          pVar17.first = (long)(char)uVar3;
        }
        else {
          pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_003d0e4c;
        this->weak_ = pVar17.first != 0;
        goto LAB_003d0c44;
      }
      break;
    default:
      if ((uVar7 == 999) && (cVar11 == ':')) {
        this_01 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar6 = input->buffer_;
        if ((puVar6 < input->buffer_end_) && (iVar14 = (int)(char)*puVar6, -1 < (char)*puVar6)) {
          input->buffer_ = puVar6 + 1;
          bVar8 = true;
        }
        else {
          iVar14 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar8 = -1 < iVar14;
        }
        if (!bVar8) goto LAB_003d0e4c;
        pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar14);
        if (((long)pVar10 < 0) ||
           (bVar8 = UninterpretedOption::MergePartialFromCodedStream(this_01,input), !bVar8)) {
          cVar11 = '\x06';
        }
        else {
          bVar8 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
          cVar11 = '\x06';
          if (bVar8) goto LAB_003d0c44;
        }
        goto LAB_003d0c46;
      }
    }
switchD_003d0bb7_caseD_4:
    if ((uVar12 & 7) == 4 || uVar12 == 0) {
      cVar11 = '\a';
    }
    else if (uVar12 < 8000) {
      pvVar5 = (this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar5 & 1) == 0) {
        pUVar15 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&this_00->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        pUVar15 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
      }
      bVar8 = internal::WireFormat::SkipField(input,uVar12,pUVar15);
      cVar11 = '\x06';
      if (bVar8) {
LAB_003d0c44:
        cVar11 = '\0';
      }
    }
    else {
      pvVar5 = (this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar5 & 1) == 0) {
        pUVar15 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&this_00->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        pUVar15 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
      }
      bVar8 = internal::ExtensionSet::ParseField
                        (&this->_extensions_,uVar12,input,
                         (Message *)&_FieldOptions_default_instance_,pUVar15);
      cVar11 = !bVar8 * '\x03' + '\x03';
    }
LAB_003d0c46:
    if ((cVar11 != '\0') && (cVar11 != '\x03')) {
      return cVar11 != '\x06';
    }
  } while( true );
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_packed();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_lazy();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_JSType_IsValid(value)) {
            set_jstype(static_cast< ::google::protobuf::FieldOptions_JSType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_weak();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldOptions)
  return false;
#undef DO_
}